

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

void Io_MvFree(Io_MvMan_t *p)

{
  int iVar1;
  Io_MvMod_t *p_00;
  int local_1c;
  int i;
  Io_MvMod_t *pMod;
  Io_MvMan_t *p_local;
  
  if (p->pDesign != (Abc_Des_t *)0x0) {
    Abc_DesFree(p->pDesign,(Abc_Ntk_t *)0x0);
  }
  if ((p->pBuffer != (char *)0x0) && (p->pBuffer != (char *)0x0)) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  if (p->vLines != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vLines);
  }
  if (p->vModels != (Vec_Ptr_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vModels), local_1c < iVar1; local_1c = local_1c + 1) {
      p_00 = (Io_MvMod_t *)Vec_PtrEntry(p->vModels,local_1c);
      Io_MvModFree(p_00);
    }
    Vec_PtrFree(p->vModels);
  }
  Vec_PtrFree(p->vTokens);
  Vec_PtrFree(p->vTokens2);
  Vec_StrFree(p->vFunc);
  if (p != (Io_MvMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static void Io_MvFree( Io_MvMan_t * p )
{
    Io_MvMod_t * pMod;
    int i;
    if ( p->pDesign )
        Abc_DesFree( p->pDesign, NULL );
    if ( p->pBuffer )  
        ABC_FREE( p->pBuffer );
    if ( p->vLines )
        Vec_PtrFree( p->vLines  );
    if ( p->vModels )
    {
        Vec_PtrForEachEntry( Io_MvMod_t *, p->vModels, pMod, i )
            Io_MvModFree( pMod );
        Vec_PtrFree( p->vModels );
    }
    Vec_PtrFree( p->vTokens );
    Vec_PtrFree( p->vTokens2 );
    Vec_StrFree( p->vFunc );
    ABC_FREE( p );
}